

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

void __thiscall flow::IRProgram::IRProgram(IRProgram *this)

{
  bool local_3a;
  allocator<char> local_39;
  string local_38;
  
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"trueLiteral",&local_39);
  ConstantValue<bool,_(flow::LiteralType)1>::ConstantValue(&this->trueLiteral_,&local_3a,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_3a = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"falseLiteral",&local_39);
  ConstantValue<bool,_(flow::LiteralType)1>::ConstantValue(&this->falseLiteral_,&local_3a,&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  memset(&this->constantArrays_,0,0xd8);
  return;
}

Assistant:

IRProgram::IRProgram()
    : modules_(),
      trueLiteral_(true, "trueLiteral"),
      falseLiteral_(false, "falseLiteral"),
      numbers_(),
      strings_(),
      ipaddrs_(),
      cidrs_(),
      regexps_(),
      builtinFunctions_(),
      builtinHandlers_(),
      handlers_() {
}